

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

MacroFormalArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroFormalArgumentSyntax,slang::parsing::Token,slang::syntax::MacroArgumentDefaultSyntax*>
          (BumpAllocator *this,Token *args,MacroArgumentDefaultSyntax **args_1)

{
  MacroArgumentDefaultSyntax *pMVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  MacroFormalArgumentSyntax *pMVar7;
  
  pMVar7 = (MacroFormalArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroFormalArgumentSyntax *)this->endPtr < pMVar7 + 1) {
    pMVar7 = (MacroFormalArgumentSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pMVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pMVar1 = *args_1;
  (pMVar7->super_SyntaxNode).kind = MacroFormalArgument;
  (pMVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar7->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar7->name).kind = TVar3;
  (pMVar7->name).field_0x2 = uVar4;
  (pMVar7->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar7->name).rawLen = uVar6;
  (pMVar7->name).info = pIVar2;
  pMVar7->defaultValue = pMVar1;
  if (pMVar1 != (MacroArgumentDefaultSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = &pMVar7->super_SyntaxNode;
  }
  return pMVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }